

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::ADC_IM(CPU *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  
  this->cycles = 2;
  bVar5 = this->A;
  uVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 1;
  uVar3 = ((this->field_6).ps & 1) + (uint)this->A + (uVar2 & 0xff);
  bVar1 = (byte)uVar3;
  this->A = bVar1;
  uVar4 = bVar5 & 0xffffff80;
  bVar5 = ((bVar1 & 0x80) != (byte)uVar4) << 6;
  if ((uVar2 & 0x80) != uVar4) {
    bVar5 = 0;
  }
  (this->field_6).ps =
       (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x3c | 0xff < uVar3 | bVar5 | bVar1 & 0x80;
  return;
}

Assistant:

void CPU::ADC_IM()
{
    cycles = 2;
    uint8_t acp = A, op = GetByte();
    uint16_t sum = A + op + C;
    A = (sum & 0xFF);
    C = (sum & 0xFF00) > 0;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
    V = (((acp & 0b10000000) ^ (op & 0b10000000)) == 0) ? (A & 0b10000000) != (acp & 0b10000000) : 0;
}